

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getV2f(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs,
           _func_void_char_ptr_V2f_ptr *check)

{
  invalid_argument *this;
  Vec2 *this_00;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  SetAttr *in_RDI;
  undefined4 in_R8D;
  string *in_R9;
  double dVar1;
  double dVar2;
  code *in_stack_00000008;
  V2f v;
  undefined4 in_stack_ffffffffffffff28;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  Vec2<float> local_44 [2];
  string *local_30;
  undefined4 local_24;
  int *local_20;
  long local_18;
  SetAttr *local_8;
  
  if (in_ESI + -3 < *in_RCX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected two floats");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  dVar1 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 1) * 8),(char **)0x0);
  dVar2 = strtod(*(char **)(local_18 + (long)(*local_20 + 2) * 8),(char **)0x0);
  Imath_3_2::Vec2<float>::Vec2(local_44,(float)dVar1,(float)dVar2);
  if (in_stack_00000008 != (code *)0x0) {
    (*in_stack_00000008)(local_8,local_44);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  this_00 = (Vec2 *)operator_new(0x10);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec2<float>>::TypedAttribute(this_00);
  SetAttr::SetAttr(local_8,local_30,(int)((ulong)this_00 >> 0x20),
                   (Attribute *)CONCAT44(local_24,in_stack_ffffffffffffff28));
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back
            ((vector<SetAttr,_std::allocator<SetAttr>_> *)this_00,
             (value_type *)CONCAT44(local_24,in_stack_ffffffffffffff28));
  SetAttr::~SetAttr((SetAttr *)0x10587b);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  *local_20 = *local_20 + 3;
  return;
}

Assistant:

void
getV2f (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs,
    void (*check) (const char attrName[], const V2f& v) = 0)
{
    if (i > argc - 3)
        throw invalid_argument ("Expected two floats");

    V2f v (
        static_cast<float> (strtod (argv[i + 1], 0)),
        static_cast<float> (strtod (argv[i + 2], 0)));

    if (check) check (attrName, v);

    attrs.push_back (SetAttr (attrName, part, new V2fAttribute (v)));
    i += 3;
}